

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

cmLocalGenerator * __thiscall
cmGlobalGenerator::FindLocalGenerator(cmGlobalGenerator *this,string *start_dir)

{
  bool bVar1;
  __type _Var2;
  reference ppcVar3;
  cmMakefile *this_00;
  char *pcVar4;
  allocator local_51;
  undefined1 local_50 [8];
  string sd;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_28;
  const_iterator it;
  string *start_dir_local;
  cmGlobalGenerator *this_local;
  
  it._M_current = (cmLocalGenerator **)start_dir;
  local_28._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                 (&this->LocalGenerators);
  while( true ) {
    sd.field_2._8_8_ =
         std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                   (&this->LocalGenerators);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)((long)&sd.field_2 + 8));
    if (!bVar1) {
      return (cmLocalGenerator *)0x0;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_28);
    this_00 = cmLocalGenerator::GetMakefile(*ppcVar3);
    pcVar4 = cmMakefile::GetCurrentSourceDirectory(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,pcVar4,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)it._M_current);
    if (_Var2) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                ::operator*(&local_28);
      this_local = (cmGlobalGenerator *)*ppcVar3;
    }
    std::__cxx11::string::~string((string *)local_50);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_28);
  }
  return (cmLocalGenerator *)this_local;
}

Assistant:

cmLocalGenerator*
cmGlobalGenerator::FindLocalGenerator(const std::string& start_dir) const
{
  for(std::vector<cmLocalGenerator*>::const_iterator it =
      this->LocalGenerators.begin(); it != this->LocalGenerators.end(); ++it)
    {
    std::string sd = (*it)->GetMakefile()->GetCurrentSourceDirectory();
    if (sd == start_dir)
      {
      return *it;
      }
    }
  return 0;
}